

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::on_bin
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *specs;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  char *__dest;
  byte *pbVar6;
  ulong uVar7;
  ptrdiff_t _Num;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *pbVar12;
  write_int_data<char> local_40;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  lVar10 = 0;
  uVar5 = this->abs_value;
  do {
    lVar10 = lVar10 + 1;
    bVar4 = 1 < uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar4);
  pbVar12 = (this->out).container;
  uVar7 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar10,prefix,specs);
  uVar5 = (ulong)specs->width;
  if (-1 < (long)uVar5) {
    uVar11 = 0;
    if (local_40.size <= uVar5) {
      uVar11 = uVar5 - local_40.size;
    }
    uVar5 = uVar11 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar3 = pbVar12->size_;
    uVar8 = local_40.size + sVar3 + (specs->fill).size_ * uVar11;
    if (pbVar12->capacity_ < uVar8) {
      (**pbVar12->_vptr_buffer)(pbVar12,uVar8);
    }
    pbVar12->size_ = uVar8;
    __dest = fill<char*,char>(pbVar12->ptr_ + sVar3,uVar5,&specs->fill);
    if (uVar7 != 0) {
      memmove(__dest,this->prefix,uVar7);
      __dest = __dest + uVar7;
    }
    pcVar9 = __dest;
    if (local_40.padding != 0) {
      pcVar9 = __dest + local_40.padding;
      memset(__dest,0x30,local_40.padding);
    }
    pbVar6 = (byte *)(pcVar9 + lVar10);
    uVar7 = this->abs_value;
    do {
      pbVar6 = pbVar6 + -1;
      *pbVar6 = (byte)uVar7 & 1 | 0x30;
      bVar4 = 1 < uVar7;
      uVar7 = uVar7 >> 1;
    } while (bVar4);
    fill<char*,char>(pcVar9 + lVar10,uVar11 - uVar5,&specs->fill);
    (this->out).container = pbVar12;
    return;
  }
  assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void on_bin() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = static_cast<char>(specs.type);
    }
    int num_digits = count_digits<1>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<1, Char>(it, abs_value, num_digits);
                    });
  }